

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O1

bool NextMove(Situation *situation,MoveGenerate *generate,Movement *hash_move,int step)

{
  MoveGenerate *__last;
  Movement *__last_00;
  Movement *pMVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  Movement *pMVar14;
  UINT8 UVar15;
  UINT8 UVar16;
  UINT8 UVar17;
  undefined1 uVar18;
  UINT32 UVar19;
  UINT8 UVar20;
  UINT8 UVar21;
  undefined2 uVar22;
  undefined1 uVar23;
  UINT8 UVar24;
  undefined2 uVar25;
  UINT8 UVar26;
  bool bVar27;
  Movement *__i;
  MoveGenerate *pMVar28;
  MoveGenerate *pMVar29;
  Movement *pMVar30;
  ulong uVar31;
  long lVar32;
  MoveGenerate *pMVar33;
  Movement *pMVar34;
  long lVar35;
  size_t sVar36;
  long lVar37;
  Movement *pMVar38;
  Movement *__i_1;
  
  switch(generate->state) {
  case 1:
    generate->state = 2;
    if ((hash_move->from == '\0') || (bVar27 = MovementsLegal(*hash_move,situation), !bVar27))
    break;
    goto LAB_00106913;
  case 2:
    break;
  case 3:
    goto switchD_00106636_caseD_3;
  case 4:
    goto switchD_00106636_caseD_4;
  case 5:
    goto switchD_00106636_caseD_5;
  case 6:
    goto switchD_00106636_caseD_6;
  case 7:
    goto switchD_00106636_caseD_7;
  default:
    return false;
  }
  GetAllCaptureMovements(situation,&generate->move_nums,generate->moves);
  CaptureValue(situation,&generate->move_nums,generate->moves);
  iVar5 = generate->move_nums;
  uVar31 = (ulong)iVar5;
  if (uVar31 != 0) {
    __last = (MoveGenerate *)(generate->moves + uVar31);
    lVar35 = 0x3f;
    if (uVar31 != 0) {
      for (; uVar31 >> lVar35 == 0; lVar35 = lVar35 + -1) {
      }
    }
    std::
    __introsort_loop<Movement*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Movement&,Movement&)>>
              (generate->moves,(Movement *)__last,(ulong)(((uint)lVar35 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(Movement_&,_Movement_&)>)0x105fda);
    if (iVar5 < 0x11) {
      if (iVar5 != 1) {
        pMVar28 = (MoveGenerate *)(generate->moves + 1);
        pMVar33 = generate;
        do {
          pMVar29 = pMVar28;
          uVar4 = pMVar29->moves[0].value;
          if (generate->moves[0].value < uVar4) {
            UVar20 = pMVar29->moves[0].catc;
            UVar21 = pMVar29->moves[0].movec;
            uVar22 = *(undefined2 *)&pMVar29->moves[0].field_0xa;
            UVar15 = pMVar29->moves[0].from;
            UVar16 = pMVar29->moves[0].to;
            UVar17 = pMVar29->moves[0].capture;
            uVar18 = pMVar29->moves[0].field_0x3;
            UVar19 = pMVar29->moves[0].value;
            memmove((void *)((long)pMVar33 + (0x18 - ((long)pMVar29 - (long)generate))),generate,
                    (long)pMVar29 - (long)generate);
            generate->moves[0].from = UVar15;
            generate->moves[0].to = UVar16;
            generate->moves[0].capture = UVar17;
            generate->moves[0].field_0x3 = uVar18;
            generate->moves[0].value = UVar19;
            generate->moves[0].catc = UVar20;
            generate->moves[0].movec = UVar21;
            *(undefined2 *)&generate->moves[0].field_0xa = uVar22;
          }
          else {
            UVar15 = pMVar33->moves[1].from;
            UVar16 = pMVar33->moves[1].to;
            UVar17 = pMVar33->moves[1].capture;
            uVar18 = pMVar33->moves[1].field_0x3;
            UVar20 = pMVar29->moves[0].catc;
            UVar21 = pMVar29->moves[0].movec;
            uVar22 = *(undefined2 *)&pMVar29->moves[0].field_0xa;
            uVar2 = pMVar33->moves[0].value;
            pMVar28 = pMVar29;
            while (uVar2 < uVar4) {
              UVar24 = pMVar28[-1].next.movec;
              uVar25 = *(undefined2 *)&pMVar28[-1].next.field_0xa;
              pMVar28->moves[0].catc = pMVar28[-1].next.catc;
              pMVar28->moves[0].movec = UVar24;
              *(undefined2 *)&pMVar28->moves[0].field_0xa = uVar25;
              UVar24 = pMVar28[-1].next.to;
              UVar26 = pMVar28[-1].next.capture;
              uVar23 = pMVar28[-1].next.field_0x3;
              UVar19 = pMVar28[-1].next.value;
              pMVar28->moves[0].from = pMVar28[-1].next.from;
              pMVar28->moves[0].to = UVar24;
              pMVar28->moves[0].capture = UVar26;
              pMVar28->moves[0].field_0x3 = uVar23;
              pMVar28->moves[0].value = UVar19;
              uVar2 = pMVar28[-1].move_nums;
              pMVar28 = (MoveGenerate *)&pMVar28[-1].next;
            }
            pMVar28->moves[0].from = UVar15;
            pMVar28->moves[0].to = UVar16;
            pMVar28->moves[0].capture = UVar17;
            pMVar28->moves[0].field_0x3 = uVar18;
            pMVar28->moves[0].value = uVar4;
            pMVar28->moves[0].catc = UVar20;
            pMVar28->moves[0].movec = UVar21;
            *(undefined2 *)&pMVar28->moves[0].field_0xa = uVar22;
          }
          pMVar28 = (MoveGenerate *)(pMVar29->moves + 1);
          pMVar33 = pMVar29;
        } while ((MoveGenerate *)(pMVar29->moves + 1) != __last);
      }
    }
    else {
      pMVar30 = generate->moves;
      sVar36 = 0xc;
      pMVar28 = generate;
      do {
        pMVar33 = (MoveGenerate *)(&generate->moves[0].from + sVar36);
        uVar4 = *(uint *)((long)&generate->moves[0].value + sVar36);
        if (generate->moves[0].value < uVar4) {
          UVar20 = pMVar33->moves[0].catc;
          UVar21 = pMVar33->moves[0].movec;
          uVar22 = *(undefined2 *)&pMVar33->moves[0].field_0xa;
          UVar15 = pMVar33->moves[0].from;
          UVar16 = pMVar33->moves[0].to;
          UVar17 = pMVar33->moves[0].capture;
          uVar18 = pMVar33->moves[0].field_0x3;
          UVar19 = pMVar33->moves[0].value;
          memmove((void *)((long)pMVar28 + (0x18 - sVar36)),generate,sVar36);
          generate->moves[0].from = UVar15;
          generate->moves[0].to = UVar16;
          generate->moves[0].capture = UVar17;
          generate->moves[0].field_0x3 = uVar18;
          generate->moves[0].value = UVar19;
          generate->moves[0].catc = UVar20;
          generate->moves[0].movec = UVar21;
          *(undefined2 *)&generate->moves[0].field_0xa = uVar22;
        }
        else {
          UVar15 = pMVar33->moves[0].from;
          UVar16 = pMVar33->moves[0].to;
          UVar17 = pMVar33->moves[0].capture;
          uVar18 = pMVar33->moves[0].field_0x3;
          UVar20 = pMVar33->moves[0].catc;
          UVar21 = pMVar33->moves[0].movec;
          uVar22 = *(undefined2 *)&pMVar33->moves[0].field_0xa;
          uVar2 = pMVar28->moves[0].value;
          pMVar28 = pMVar33;
          pMVar29 = (MoveGenerate *)(pMVar30 + 1);
          while (uVar2 < uVar4) {
            pMVar28 = (MoveGenerate *)((long)(pMVar29 + 0xffffffffffffffff) + 0x60c);
            *(undefined4 *)((long)pMVar29->moves + 8) =
                 *(undefined4 *)((long)(pMVar29 + 0xffffffffffffffff) + 0x614);
            *(undefined8 *)pMVar29->moves =
                 *(undefined8 *)((long)(pMVar29 + 0xffffffffffffffff) + 0x60c);
            uVar2 = *(int *)((long)(pMVar29 + 0xffffffffffffffff) + 0x604);
            pMVar29 = pMVar28;
          }
          pMVar28->moves[0].from = UVar15;
          pMVar28->moves[0].to = UVar16;
          pMVar28->moves[0].capture = UVar17;
          pMVar28->moves[0].field_0x3 = uVar18;
          pMVar28->moves[0].value = uVar4;
          pMVar28->moves[0].catc = UVar20;
          pMVar28->moves[0].movec = UVar21;
          *(undefined2 *)&pMVar28->moves[0].field_0xa = uVar22;
        }
        sVar36 = sVar36 + 0xc;
        pMVar30 = ((MoveGenerate *)(pMVar30 + 1))->moves;
        pMVar28 = pMVar33;
      } while (sVar36 != 0xc0);
      pMVar28 = (MoveGenerate *)(generate->moves + 0x10);
      do {
        UVar15 = pMVar28->moves[0].from;
        UVar16 = pMVar28->moves[0].to;
        UVar17 = pMVar28->moves[0].capture;
        uVar18 = pMVar28->moves[0].field_0x3;
        uVar6 = pMVar28->moves[0].value;
        uVar8 = pMVar28->moves[0].catc;
        uVar10 = pMVar28->moves[0].movec;
        uVar12 = *(undefined2 *)&pMVar28->moves[0].field_0xa;
        uVar4 = pMVar28[-1].next.value;
        pMVar33 = pMVar28;
        while (uVar4 < (uint)uVar6) {
          UVar20 = pMVar33[-1].next.movec;
          uVar22 = *(undefined2 *)&pMVar33[-1].next.field_0xa;
          pMVar33->moves[0].catc = pMVar33[-1].next.catc;
          pMVar33->moves[0].movec = UVar20;
          *(undefined2 *)&pMVar33->moves[0].field_0xa = uVar22;
          UVar20 = pMVar33[-1].next.to;
          UVar21 = pMVar33[-1].next.capture;
          uVar23 = pMVar33[-1].next.field_0x3;
          UVar19 = pMVar33[-1].next.value;
          pMVar33->moves[0].from = pMVar33[-1].next.from;
          pMVar33->moves[0].to = UVar20;
          pMVar33->moves[0].capture = UVar21;
          pMVar33->moves[0].field_0x3 = uVar23;
          pMVar33->moves[0].value = UVar19;
          uVar4 = pMVar33[-1].move_nums;
          pMVar33 = (MoveGenerate *)&pMVar33[-1].next;
        }
        pMVar33->moves[0].from = UVar15;
        pMVar33->moves[0].to = UVar16;
        pMVar33->moves[0].capture = UVar17;
        pMVar33->moves[0].field_0x3 = uVar18;
        pMVar33->moves[0].value = uVar6;
        pMVar33->moves[0].catc = uVar8;
        pMVar33->moves[0].movec = uVar10;
        *(undefined2 *)&pMVar33->moves[0].field_0xa = uVar12;
        pMVar28 = (MoveGenerate *)(pMVar28->moves + 1);
      } while (pMVar28 != __last);
    }
  }
  generate->index = 0;
  generate->state = 3;
switchD_00106636_caseD_3:
  iVar5 = generate->index;
  if ((iVar5 < generate->move_nums) && (1 < generate->moves[iVar5].value)) {
    pMVar30 = generate->moves + iVar5;
    UVar15 = pMVar30->movec;
    uVar22 = *(undefined2 *)&pMVar30->field_0xa;
    (generate->next).catc = pMVar30->catc;
    (generate->next).movec = UVar15;
    *(undefined2 *)&(generate->next).field_0xa = uVar22;
    UVar15 = pMVar30->to;
    UVar16 = pMVar30->capture;
    uVar18 = pMVar30->field_0x3;
    UVar19 = pMVar30->value;
    (generate->next).from = pMVar30->from;
    (generate->next).to = UVar15;
    (generate->next).capture = UVar16;
    (generate->next).field_0x3 = uVar18;
    (generate->next).value = UVar19;
    generate->index = iVar5 + 1;
    return true;
  }
switchD_00106636_caseD_4:
  generate->state = 5;
  if (KillerTable[step][0].from == '\0') {
switchD_00106636_caseD_5:
    generate->state = 6;
    if (KillerTable[step][1].from != '\0') {
      hash_move = KillerTable[step] + 1;
      bVar27 = MovementsLegal(*hash_move,situation);
      if (bVar27) goto LAB_00106913;
    }
switchD_00106636_caseD_6:
    iVar5 = generate->move_nums;
    lVar35 = (long)iVar5;
    GetAllNotCaptureMovements(situation,&generate->move_nums,generate->moves);
    iVar3 = generate->move_nums;
    if (iVar5 < iVar3) {
      pMVar30 = generate->moves + lVar35;
      lVar32 = lVar35;
      do {
        pMVar30->value = HistoryTable[pMVar30->from][pMVar30->to];
        lVar32 = lVar32 + 1;
        pMVar30 = pMVar30 + 1;
      } while (lVar32 < generate->move_nums);
    }
    if (iVar5 != iVar3) {
      pMVar30 = generate->moves + lVar35;
      __last_00 = generate->moves + iVar3;
      lVar37 = (long)iVar3 * 0xc + lVar35 * -0xc;
      uVar31 = (lVar37 >> 2) * -0x5555555555555555;
      lVar32 = 0x3f;
      if (uVar31 != 0) {
        for (; uVar31 >> lVar32 == 0; lVar32 = lVar32 + -1) {
        }
      }
      std::
      __introsort_loop<Movement*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Movement&,Movement&)>>
                (pMVar30,__last_00,(ulong)(((uint)lVar32 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(Movement_&,_Movement_&)>)0x105fda);
      pMVar38 = pMVar30;
      if (lVar37 < 0xc1) {
        while (pMVar34 = pMVar38 + 1, pMVar34 != __last_00) {
          uVar4 = pMVar34->value;
          if (pMVar30->value < uVar4) {
            UVar20 = pMVar34->catc;
            UVar21 = pMVar34->movec;
            uVar22 = *(undefined2 *)&pMVar34->field_0xa;
            UVar15 = pMVar34->from;
            UVar16 = pMVar34->to;
            UVar17 = pMVar34->capture;
            uVar18 = pMVar34->field_0x3;
            UVar19 = pMVar34->value;
            memmove((void *)((long)pMVar38 + (0x18 - ((long)pMVar34 - (long)pMVar30))),pMVar30,
                    (long)pMVar34 - (long)pMVar30);
            pMVar30->from = UVar15;
            pMVar30->to = UVar16;
            pMVar30->capture = UVar17;
            pMVar30->field_0x3 = uVar18;
            pMVar30->value = UVar19;
            pMVar30->catc = UVar20;
            pMVar30->movec = UVar21;
            *(undefined2 *)&pMVar30->field_0xa = uVar22;
            pMVar38 = pMVar34;
          }
          else {
            UVar15 = pMVar34->from;
            UVar16 = pMVar34->to;
            UVar17 = pMVar34->capture;
            uVar18 = pMVar34->field_0x3;
            UVar20 = pMVar34->catc;
            UVar21 = pMVar34->movec;
            uVar22 = *(undefined2 *)&pMVar34->field_0xa;
            uVar2 = pMVar38->value;
            pMVar38 = pMVar34;
            while (uVar2 < uVar4) {
              UVar24 = pMVar38[-1].movec;
              uVar25 = *(undefined2 *)&pMVar38[-1].field_0xa;
              pMVar38->catc = pMVar38[-1].catc;
              pMVar38->movec = UVar24;
              *(undefined2 *)&pMVar38->field_0xa = uVar25;
              UVar24 = pMVar38[-1].to;
              UVar26 = pMVar38[-1].capture;
              uVar23 = pMVar38[-1].field_0x3;
              UVar19 = pMVar38[-1].value;
              pMVar38->from = pMVar38[-1].from;
              pMVar38->to = UVar24;
              pMVar38->capture = UVar26;
              pMVar38->field_0x3 = uVar23;
              pMVar38->value = UVar19;
              uVar2 = pMVar38[-2].value;
              pMVar38 = pMVar38 + -1;
            }
            pMVar38->from = UVar15;
            pMVar38->to = UVar16;
            pMVar38->capture = UVar17;
            pMVar38->field_0x3 = uVar18;
            pMVar38->value = uVar4;
            pMVar38->catc = UVar20;
            pMVar38->movec = UVar21;
            *(undefined2 *)&pMVar38->field_0xa = uVar22;
            pMVar38 = pMVar34;
          }
        }
      }
      else {
        pMVar38 = generate->moves + lVar35;
        sVar36 = 0xc;
        pMVar34 = pMVar30;
        do {
          pMVar38 = pMVar38 + 1;
          pMVar1 = (Movement *)(&pMVar30->from + sVar36);
          uVar4 = *(uint *)((long)&pMVar30->value + sVar36);
          if (pMVar30->value < uVar4) {
            UVar20 = pMVar1->catc;
            UVar21 = pMVar1->movec;
            uVar22 = *(undefined2 *)&pMVar1->field_0xa;
            UVar15 = pMVar1->from;
            UVar16 = pMVar1->to;
            UVar17 = pMVar1->capture;
            uVar18 = pMVar1->field_0x3;
            UVar19 = pMVar1->value;
            memmove((void *)((long)pMVar34 + (0x18 - sVar36)),pMVar30,sVar36);
            pMVar30->from = UVar15;
            pMVar30->to = UVar16;
            pMVar30->capture = UVar17;
            pMVar30->field_0x3 = uVar18;
            pMVar30->value = UVar19;
            pMVar30->catc = UVar20;
            pMVar30->movec = UVar21;
            *(undefined2 *)&pMVar30->field_0xa = uVar22;
          }
          else {
            UVar15 = pMVar1->from;
            UVar16 = pMVar1->to;
            UVar17 = pMVar1->capture;
            uVar18 = pMVar1->field_0x3;
            UVar20 = pMVar1->catc;
            UVar21 = pMVar1->movec;
            uVar22 = *(undefined2 *)&pMVar1->field_0xa;
            uVar2 = pMVar34->value;
            pMVar34 = pMVar1;
            pMVar14 = pMVar38;
            while (uVar2 < uVar4) {
              pMVar34 = pMVar14 + -1;
              UVar24 = pMVar14[-1].movec;
              uVar25 = *(undefined2 *)&pMVar14[-1].field_0xa;
              pMVar14->catc = pMVar14[-1].catc;
              pMVar14->movec = UVar24;
              *(undefined2 *)&pMVar14->field_0xa = uVar25;
              UVar24 = pMVar14[-1].to;
              UVar26 = pMVar14[-1].capture;
              uVar23 = pMVar14[-1].field_0x3;
              UVar19 = pMVar14[-1].value;
              pMVar14->from = pMVar14[-1].from;
              pMVar14->to = UVar24;
              pMVar14->capture = UVar26;
              pMVar14->field_0x3 = uVar23;
              pMVar14->value = UVar19;
              uVar2 = pMVar14[-2].value;
              pMVar14 = pMVar34;
            }
            pMVar34->from = UVar15;
            pMVar34->to = UVar16;
            pMVar34->capture = UVar17;
            pMVar34->field_0x3 = uVar18;
            pMVar34->value = uVar4;
            pMVar34->catc = UVar20;
            pMVar34->movec = UVar21;
            *(undefined2 *)&pMVar34->field_0xa = uVar22;
          }
          sVar36 = sVar36 + 0xc;
          pMVar34 = pMVar1;
        } while (sVar36 != 0xc0);
        for (pMVar30 = pMVar30 + 0x10; pMVar30 != __last_00; pMVar30 = pMVar30 + 1) {
          UVar15 = pMVar30->from;
          UVar16 = pMVar30->to;
          UVar17 = pMVar30->capture;
          uVar18 = pMVar30->field_0x3;
          uVar7 = pMVar30->value;
          uVar9 = pMVar30->catc;
          uVar11 = pMVar30->movec;
          uVar13 = *(undefined2 *)&pMVar30->field_0xa;
          uVar4 = pMVar30[-1].value;
          pMVar38 = pMVar30;
          while (uVar4 < (uint)uVar7) {
            UVar20 = pMVar38[-1].movec;
            uVar22 = *(undefined2 *)&pMVar38[-1].field_0xa;
            pMVar38->catc = pMVar38[-1].catc;
            pMVar38->movec = UVar20;
            *(undefined2 *)&pMVar38->field_0xa = uVar22;
            UVar20 = pMVar38[-1].to;
            UVar21 = pMVar38[-1].capture;
            uVar23 = pMVar38[-1].field_0x3;
            UVar19 = pMVar38[-1].value;
            pMVar38->from = pMVar38[-1].from;
            pMVar38->to = UVar20;
            pMVar38->capture = UVar21;
            pMVar38->field_0x3 = uVar23;
            pMVar38->value = UVar19;
            uVar4 = pMVar38[-2].value;
            pMVar38 = pMVar38 + -1;
          }
          pMVar38->from = UVar15;
          pMVar38->to = UVar16;
          pMVar38->capture = UVar17;
          pMVar38->field_0x3 = uVar18;
          pMVar38->value = uVar7;
          pMVar38->catc = uVar9;
          pMVar38->movec = uVar11;
          *(undefined2 *)&pMVar38->field_0xa = uVar13;
        }
      }
    }
    generate->state = 7;
switchD_00106636_caseD_7:
    iVar5 = generate->index;
    if (generate->move_nums <= iVar5) {
      return false;
    }
    pMVar30 = generate->moves + iVar5;
    UVar15 = pMVar30->movec;
    uVar22 = *(undefined2 *)&pMVar30->field_0xa;
    (generate->next).catc = pMVar30->catc;
    (generate->next).movec = UVar15;
    *(undefined2 *)&(generate->next).field_0xa = uVar22;
    pMVar30 = generate->moves + iVar5;
    UVar15 = pMVar30->to;
    UVar16 = pMVar30->capture;
    uVar18 = pMVar30->field_0x3;
    UVar19 = pMVar30->value;
    (generate->next).from = pMVar30->from;
    (generate->next).to = UVar15;
    (generate->next).capture = UVar16;
    (generate->next).field_0x3 = uVar18;
    (generate->next).value = UVar19;
    generate->index = iVar5 + 1;
  }
  else {
    hash_move = KillerTable[step];
    bVar27 = MovementsLegal(*hash_move,situation);
    if (!bVar27) goto switchD_00106636_caseD_5;
LAB_00106913:
    UVar15 = hash_move->movec;
    uVar22 = *(undefined2 *)&hash_move->field_0xa;
    (generate->next).catc = hash_move->catc;
    (generate->next).movec = UVar15;
    *(undefined2 *)&(generate->next).field_0xa = uVar22;
    UVar15 = hash_move->to;
    UVar16 = hash_move->capture;
    uVar18 = hash_move->field_0x3;
    UVar19 = hash_move->value;
    (generate->next).from = hash_move->from;
    (generate->next).to = UVar15;
    (generate->next).capture = UVar16;
    (generate->next).field_0x3 = uVar18;
    (generate->next).value = UVar19;
  }
  return true;
}

Assistant:

bool NextMove(const Situation& situation, MoveGenerate& generate, Movement& hash_move, int step){
    int flag;
    switch (generate.state)
    {
    case HASH_GET:
        generate.state = CAP_GEN;
        if(hash_move.from && MovementsLegal(hash_move, situation)){
            generate.next = hash_move;
            return true;
        }
    case CAP_GEN:   // 生成吃子着法
        GetAllCaptureMovements(situation, generate.move_nums, generate.moves);
        CaptureValue(situation, generate.move_nums, generate.moves);
        std::sort(generate.moves, generate.moves + generate.move_nums, cmp);

        generate.index = 0;
        generate.state = CAP_GET;
    case CAP_GET:
        if(generate.index < generate.move_nums && generate.moves[generate.index].value > 1){
            generate.next = generate.moves[generate.index];
            generate.index++;
            return true;
        }
    case KILL1_GET:
        generate.state = KILL2_GET;
        if(KillerTable[step][0].from && MovementsLegal(KillerTable[step][0], situation)){
            generate.next = KillerTable[step][0];
            return true;
        }
    case KILL2_GET:
        generate.state = NOCAP_GEN;
        if(KillerTable[step][1].from && MovementsLegal(KillerTable[step][1], situation)){
            generate.next = KillerTable[step][1];
            return true;
        }
    case NOCAP_GEN:
        flag = generate.move_nums;
        GetAllNotCaptureMovements(situation, generate.move_nums, generate.moves);
        NoCaptureValue(situation, generate.move_nums, generate.moves, flag);
        std::sort(generate.moves + flag, generate.moves + generate.move_nums, cmp);
    
        generate.state = NOCAP_GET;
    case NOCAP_GET:
        if(generate.index < generate.move_nums){
            generate.next = generate.moves[generate.index];
            generate.index++;
            return true;
        }
    default:
        return false;
    }
}